

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlIsDocNameStartChar(xmlDocPtr doc,int c)

{
  int iVar1;
  
  if ((doc == (xmlDocPtr)0x0) || ((doc->properties & 4) == 0)) {
    if ((c & 0xffffffdfU) - 0x41 < 0x1a) {
      return 1;
    }
    if (c == 0x3a) {
      return 1;
    }
    if (c == 0x5f) {
      return 1;
    }
    if (c - 0x10000U < 0xe0000) {
      return 1;
    }
    if (c - 0xfdf0U < 0x20e) {
      return 1;
    }
    if (c - 0xf900U < 0x4d0) {
      return 1;
    }
    if (c - 0x3001U < 0xa7ff) {
      return 1;
    }
    if (c - 0x2c00U < 0x3f0) {
      return 1;
    }
    if (c - 0x2070U < 0x120) {
      return 1;
    }
    if ((c & 0xfffffffeU) == 0x200c) {
      return 1;
    }
    if (c - 0x37fU < 0x1c81) {
      return 1;
    }
    if (c - 0x370U < 0xe) {
      return 1;
    }
    if (c - 0xf8U < 0x208) {
      return 1;
    }
    if (c - 0xc0U < 0x17) {
      return 1;
    }
    if (c - 0xd8U < 0x1f) {
      return 1;
    }
  }
  else {
    if (c < 0x100) {
      if (c - 0xc0U < 0x17) {
        return 1;
      }
      if ((c & 0xffffffdfU) - 0x41 < 0x1a) {
        return 1;
      }
      if (0xf7 < c || c - 0xd8U < 0x1f) {
        return 1;
      }
    }
    else {
      iVar1 = xmlCharInRange(c,&xmlIsBaseCharGroup);
      if (iVar1 != 0) {
        return 1;
      }
    }
    if (c < 0x100) {
      return (uint)(c == 0x3a || c == 0x5f);
    }
    if ((c - 0x3021U < 9 || c - 0x4e00U < 0x51a6) || c == 0x3007) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
xmlIsDocNameStartChar(xmlDocPtr doc, int c) {
    if ((doc == NULL) || (doc->properties & XML_DOC_OLD10) == 0) {
        /*
	 * Use the new checks of production [4] [4a] amd [5] of the
	 * Update 5 of XML-1.0
	 */
	if (((c >= 'a') && (c <= 'z')) ||
	    ((c >= 'A') && (c <= 'Z')) ||
	    (c == '_') || (c == ':') ||
	    ((c >= 0xC0) && (c <= 0xD6)) ||
	    ((c >= 0xD8) && (c <= 0xF6)) ||
	    ((c >= 0xF8) && (c <= 0x2FF)) ||
	    ((c >= 0x370) && (c <= 0x37D)) ||
	    ((c >= 0x37F) && (c <= 0x1FFF)) ||
	    ((c >= 0x200C) && (c <= 0x200D)) ||
	    ((c >= 0x2070) && (c <= 0x218F)) ||
	    ((c >= 0x2C00) && (c <= 0x2FEF)) ||
	    ((c >= 0x3001) && (c <= 0xD7FF)) ||
	    ((c >= 0xF900) && (c <= 0xFDCF)) ||
	    ((c >= 0xFDF0) && (c <= 0xFFFD)) ||
	    ((c >= 0x10000) && (c <= 0xEFFFF)))
	    return(1);
    } else {
        if (IS_LETTER(c) || (c == '_') || (c == ':'))
	    return(1);
    }
    return(0);
}